

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O3

void __thiscall
ExchangeCompilation_TwoDefinitions_Test::TestBody(ExchangeCompilation_TwoDefinitions_Test *this)

{
  uint64_t *puVar1;
  digest d;
  __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
  last_member;
  extent<pstore::repo::fragment> x;
  extent<pstore::repo::fragment> x_00;
  AssertHelper AVar2;
  element_type *peVar3;
  shared_ptr<const_pstore::repo::compilation> sVar4;
  element_type *peVar5;
  uint generation;
  mapped_type *pmVar6;
  string *psVar7;
  parser<pstore::exchange::import_ns::callbacks> *ppVar8;
  ostream *poVar9;
  pointer *__ptr_3;
  database *pdVar10;
  char *pcVar11;
  pointer *__ptr;
  __shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2> _Var12;
  initializer_list<pstore::repo::definition> __l;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  AssertHelper local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f0;
  vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> definitions;
  undefined1 local_4d0 [8];
  shared_ptr<const_pstore::repo::compilation> compilation;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  mock_mutex mutex;
  extent<pstore::repo::compilation> compilation_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  index_pointer local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  index_pointer iStack_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e0;
  index_pointer iStack_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d0;
  _Alloc_hider _Stack_3c8;
  element_type *local_3c0;
  undefined1 local_3b8 [8];
  mock_mutex mutex_1;
  digest fragment_digest;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388 [2];
  undefined1 local_368 [48];
  error_category *local_338;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_328;
  _Alloc_hider local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [5];
  _Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_false>
  local_2b0;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  char *triple;
  char *name2;
  char *name1;
  digest compilation_digest;
  string_mapping imported_names;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  string_mapping exported_names;
  ostringstream exported_fragment_stream;
  ostringstream exported_compilation_stream;
  ostringstream exported_names_stream;
  array<const_char_*,_3UL> names;
  
  name1 = "name1";
  name2 = "name2";
  triple = "triple";
  names._M_elems[2] = "name2";
  names._M_elems[0] = "triple";
  names._M_elems[1] = "name1";
  indir_strings._M_h._M_buckets = &indir_strings._M_h._M_single_bucket;
  indir_strings._M_h._M_bucket_count = 1;
  indir_strings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indir_strings._M_h._M_element_count = 0;
  indir_strings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  indir_strings._M_h._M_rehash_policy._M_next_resize = 0;
  indir_strings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pdVar10 = &(this->super_ExchangeCompilation).export_db_;
  out.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )0x0;
  out.container = &indir_strings;
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (pdVar10,names._M_elems,(char **)&stack0xffffffffffffffd0,out);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            (&exported_names,pdVar10);
  pstore::exchange::export_ns::ostream_base::ostream_base
            (&exported_names_stream.super_ostream_base,0x1000);
  exported_names_stream.str_._M_dataplus._M_p = (pointer)&exported_names_stream.str_.field_2;
  exported_names_stream.super_ostream_base._vptr_ostream_base =
       (_func_int **)&PTR__ostringstream_0023b498;
  exported_names_stream.str_._M_string_length = 0;
  exported_names_stream.str_.field_2._M_local_buf[0] = '\0';
  generation = pstore::database::get_current_revision(pdVar10);
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398);
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            (&exported_names_stream.super_ostream_base,(indent)0x0,pdVar10,generation,
             (string *)local_398,&exported_names,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388[0]._M_allocated_capacity + 1);
  }
  compilation_digest.v_._0_8_ = 0x9abcdef0;
  compilation_digest.v_._8_8_ = 0x12345678;
  fragment_digest.v_._0_8_ = (address)0x12345678;
  fragment_digest.v_._8_8_ = (database *)0x9abcdef0;
  pstore::exchange::export_ns::ostream_base::ostream_base
            (&exported_compilation_stream.super_ostream_base,0x1000);
  exported_compilation_stream.str_._M_dataplus._M_p =
       (pointer)&exported_compilation_stream.str_.field_2;
  exported_compilation_stream.super_ostream_base._vptr_ostream_base =
       (_func_int **)&PTR__ostringstream_0023b498;
  exported_compilation_stream.str_._M_string_length = 0;
  exported_compilation_stream.str_.field_2._M_local_buf[0] = '\0';
  pstore::exchange::export_ns::ostream_base::ostream_base
            (&exported_fragment_stream.super_ostream_base,0x1000);
  exported_fragment_stream.str_._M_dataplus._M_p = (pointer)&exported_fragment_stream.str_.field_2;
  exported_fragment_stream.super_ostream_base._vptr_ostream_base =
       (_func_int **)&PTR__ostringstream_0023b498;
  exported_fragment_stream.str_._M_string_length = 0;
  exported_fragment_stream.str_.field_2._M_local_buf[0] = '\0';
  local_398._0_8_ = &mutex_1;
  local_398[8] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_398);
  local_398[8] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names,pdVar10,
             (lock_type *)local_398);
  compilation_1.addr.a_.a_._0_1_ = 2;
  memset(&compilation_1.size,0,0xa0);
  local_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iStack_3e8.internal_ = (internal_node *)0x0;
  local_3e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iStack_3d8.internal_ = (internal_node *)0x0;
  local_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_3c8._M_p = (pointer)0x0;
  compilation_1.addr.a_.a_._1_1_ = 4;
  local_3f8.internal_ = (internal_node *)local_490;
  pstore::small_vector<unsigned_char,_128UL>::resize
            ((small_vector<unsigned_char,_128UL> *)&compilation_1.size,0x80);
  definitions.
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 2;
  definitions.
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__section_creation_dispatcher_0023cc68;
  definitions.
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f8.data_ = (AssertHelperData *)&compilation_1;
  pstore::gsl::not_null<const_pstore::repo::section_content_*>::ensure_invariant
            ((not_null<const_pstore::repo::section_content_*> *)&local_4f8);
  AVar2.data_ = local_4f8.data_;
  pstore::repo::bss_section_creation_dispatcher::validate
            ((not_null<const_pstore::repo::section_content_*>)local_4f8.data_);
  definitions.
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar2.data_;
  _Var12 = (__shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>)
           pstore::repo::fragment::
           alloc<pstore::transaction<std::unique_lock<mock_mutex>>,pstore::repo::bss_section_creation_dispatcher*>
                     ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names,
                      (bss_section_creation_dispatcher *)&definitions,
                      (bss_section_creation_dispatcher *)local_4d0);
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&compilation_index,
             (database *)
             imported_names.adder_.views_.
             super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,true);
  transaction.super_transaction_base._vptr_transaction_base = (_func_int **)fragment_digest.v_._0_8_
  ;
  transaction.super_transaction_base.db_ = fragment_digest.v_._8_8_;
  transaction.super_transaction_base._16_16_ = _Var12;
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::insert_or_upsert<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
            ((pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
              *)local_398,
             (hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
              *)compilation_index.
                super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,(transaction_base *)&imported_names,
             (pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)&transaction,false);
  if ((__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
       )local_2b0._M_head_impl !=
      (__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
       )0x0) {
    operator_delete(local_2b0._M_head_impl,0x20);
  }
  local_2b0._M_head_impl =
       (pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)0x0;
  if (compilation_index.
      super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (compilation_index.
               super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pstore::repo::section_creation_dispatcher::~section_creation_dispatcher
            ((section_creation_dispatcher *)&definitions);
  if ((pointer)iStack_3d8.internal_ != (pointer)0x0) {
    operator_delete(iStack_3d8.internal_,(long)_Stack_3c8._M_p - (long)iStack_3d8);
  }
  if ((pointer)local_3f0._M_pi != (pointer)0x0) {
    operator_delete(local_3f0._M_pi,(long)local_3e0._M_pi - (long)local_3f0._M_pi);
  }
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_410._M_pi,(long)local_400._M_pi - (long)local_410._M_pi);
  }
  compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2> =
       _Var12;
  pstore::database::getro<pstore::repo::fragment,void>
            ((database *)local_398,(extent<pstore::repo::fragment> *)pdVar10);
  pstore::exchange::export_ns::emit_fragment
            (&exported_fragment_stream.super_ostream_base,(indent)0x0,pdVar10,&exported_names,
             (shared_ptr<const_pstore::repo::fragment> *)local_398,false);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_398._9_7_,local_398[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_398._9_7_,local_398[8]));
  }
  sVar4.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2> =
       compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>;
  x.size = (uint64_t)fragment_digest.v_._8_8_;
  x.addr.a_.a_ = fragment_digest.v_._0_8_;
  peVar3 = compilation.
           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  compilation_1.addr.a_.a_ = (address)(address)local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&compilation_1,"name1","");
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)&compilation_1);
  d.v_._8_8_ = 1;
  d.v_._0_8_ = 4;
  pstore::repo::definition::definition
            ((definition *)local_398,d,x,(typed_address<pstore::indirect_string>)peVar3,
             (linkage)sVar4.
                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,(visibility)(pmVar6->a_).a_);
  sVar4 = compilation;
  x_00.size = (uint64_t)fragment_digest.v_._8_8_;
  x_00.addr.a_.a_ = fragment_digest.v_._0_8_;
  peVar3 = compilation.
           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar1 = &transaction.super_transaction_base.size_;
  transaction.super_transaction_base._vptr_transaction_base = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&transaction,"name2","");
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)&transaction);
  pstore::repo::definition::definition
            ((definition *)local_368,(digest)ZEXT816(5),x_00,
             (typed_address<pstore::indirect_string>)peVar3,
             (linkage)sVar4.
                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,(visibility)(pmVar6->a_).a_);
  __l._M_len = 2;
  __l._M_array = (iterator)local_398;
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::vector
            (&definitions,__l,(allocator_type *)&compilation_index);
  if (transaction.super_transaction_base._vptr_transaction_base != (_func_int **)puVar1) {
    operator_delete(transaction.super_transaction_base._vptr_transaction_base,
                    transaction.super_transaction_base.size_ + 1);
  }
  if (compilation_1.addr.a_.a_ != (address)local_490) {
    operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1);
  }
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"triple","");
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)local_398);
  last_member._M_current._1_7_ =
       definitions.
       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
       _M_impl.super__Vector_impl_data._M_finish._1_7_;
  last_member._M_current._0_1_ =
       definitions.
       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
       _M_impl.super__Vector_impl_data._M_finish._0_1_;
  compilation_1 =
       pstore::repo::compilation::
       alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                 ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names,
                  (typed_address<pstore::indirect_string>)(pmVar6->a_).a_,
                  (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                   )definitions.
                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                    ._M_impl.super__Vector_impl_data._M_start,last_member);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388[0]._M_allocated_capacity + 1);
  }
  pstore::database::getro<pstore::repo::compilation,void>
            ((database *)local_398,(extent<pstore::repo::compilation> *)pdVar10);
  pcVar11 = (char *)0x0;
  pstore::exchange::export_ns::emit_compilation
            (&exported_compilation_stream.super_ostream_base,(indent)0x0,pdVar10,
             (compilation *)local_398._0_8_,&exported_names,false);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_398._9_7_,local_398[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_398._9_7_,local_398[8]));
  }
  pstore::transaction_base::commit((transaction_base *)&imported_names);
  if (definitions.
      super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(definitions.
                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__transaction_00234578;
  pstore::transaction_base::rollback((transaction_base *)&imported_names);
  local_398._0_8_ = &mutex;
  local_398[8] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_398);
  pdVar10 = &(this->super_ExchangeCompilation).import_db_;
  local_398[8] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,pdVar10,(lock_type *)local_398);
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.strings_;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.views_;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.lookup_._M_h._M_buckets = &imported_names.lookup_._M_h._M_single_bucket;
  imported_names.lookup_._M_h._M_bucket_count = 1;
  imported_names.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  imported_names.lookup_._M_h._M_element_count = 0;
  imported_names.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  imported_names.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  anon_unknown.dwarf_a82ba::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_398,&transaction,
             &imported_names);
  psVar7 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
  ppVar8 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)local_398,psVar7);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar8);
  compilation_index.
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            CONCAT71(compilation_index.
                     super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr._1_7_,local_368._40_4_ == 0);
  compilation_index.
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_368._40_4_ == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_p != local_308) {
      operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
    }
    if (local_328._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)(local_398 + 8));
    if ((mock_mutex *)local_398._0_8_ != (mock_mutex *)0x0) {
      operator_delete((void *)local_398._0_8_,0x68);
    }
    compilation_index.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)transaction.super_transaction_base.db_;
    pstore::gsl::not_null<pstore::database_*>::ensure_invariant
              ((not_null<pstore::database_*> *)&compilation_index);
    pstore::exchange::import_ns::callbacks::
    make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>
              ((callbacks *)&definitions,
               (not_null<pstore::database_*>)
               compilation_index.
               super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,&transaction,&imported_names,&fragment_digest);
    compilation_1.size =
         CONCAT71(definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    compilation_1.addr.a_.a_ =
         (address)(address)definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    if (compilation_1.size != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(compilation_1.size + 8) = *(int *)(compilation_1.size + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(compilation_1.size + 8) = *(int *)(compilation_1.size + 8) + 1;
      }
    }
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
              ((parser<pstore::exchange::import_ns::callbacks> *)local_398,
               (callbacks *)&compilation_1,none);
    if (compilation_1.size != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)compilation_1.size);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT71(definitions.
                 super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                 definitions.
                 super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT71(definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                          definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_1_));
    }
    psVar7 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_fragment_stream);
    ppVar8 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       ((parser<pstore::exchange::import_ns::callbacks> *)local_398,psVar7);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar8);
    compilation_index.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT71(compilation_index.
                       super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._1_7_,local_368._40_4_ == 0);
    compilation_index.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (local_368._40_4_ == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p != local_308) {
        operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
      }
      if (local_328._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328._M_pi);
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
      ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                *)(local_398 + 8));
      if ((mock_mutex *)local_398._0_8_ != (mock_mutex *)0x0) {
        operator_delete((void *)local_398._0_8_,0x68);
      }
      pstore::index::
      get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)&compilation_index,pdVar10,true);
      anon_unknown.dwarf_a82ba::import_compilation_parser
                ((parser<pstore::exchange::import_ns::callbacks> *)local_398,&transaction,
                 &imported_names,
                 (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                  *)&compilation_index,&compilation_digest);
      psVar7 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                         (&exported_compilation_stream);
      ppVar8 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                         ((parser<pstore::exchange::import_ns::callbacks> *)local_398,psVar7);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar8);
      compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._0_1_ = local_368._40_4_ == 0;
      compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_368._40_4_ == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_p != local_308) {
          operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
        }
        if (local_328._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328._M_pi);
        }
        std::
        deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
        ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                  *)(local_398 + 8));
        if ((mock_mutex *)local_398._0_8_ != (mock_mutex *)0x0) {
          operator_delete((void *)local_398._0_8_,0x68);
        }
        if (compilation_index.
            super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (compilation_index.
                     super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        pstore::index::
        get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                  ((index *)&compilation_index,pdVar10,true);
        pstore::index::
        hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
        ::find<pstore::uint128,void>
                  ((const_iterator *)local_398,
                   (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                    *)compilation_index.
                      super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,pdVar10,&compilation_digest);
        peVar5 = compilation_index.
                 super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        memset(&compilation_1.size,0,0xd8);
        compilation_1.addr.a_.a_ = (address)(address)pdVar10;
        local_3c0 = peVar5;
        local_3b8 = (undefined1  [8])0x0;
        testing::internal::
        CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
                  ((internal *)&definitions,"pos","compilation_index->end (import_db_)",
                   (iterator_base<true> *)local_398,(iterator_base<false> *)&compilation_1);
        if (local_3b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3b8,0x20);
        }
        if ((char)definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&compilation_1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)compilation_1.addr.a_.a_ + 0x10),
                     "Compilation was not found in the index after import",0x33);
          pcVar11 = "";
          if ((undefined8 *)
              CONCAT71(definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                       definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._0_1_) != (undefined8 *)0x0) {
            pcVar11 = *(char **)CONCAT71(definitions.
                                         super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                         definitions.
                                         super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._0_1_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&compilation,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                     ,0x128,pcVar11);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&compilation,(Message *)&compilation_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&compilation);
          if (compilation_1.addr.a_.a_ != 0) {
            (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                       definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&definitions.
                             super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                  definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._0_1_));
          }
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                       definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&definitions.
                             super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                  definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._0_1_));
          }
          pstore::index::
          hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::iterator_base<true>::operator*((iterator_base<true> *)local_398);
          pstore::database::getro<pstore::repo::compilation,void>
                    ((database *)&compilation,(extent<pstore::repo::compilation> *)pdVar10);
          pstore::indirect_string::read
                    ((int)&definitions,pdVar10,
                     ((compilation.
                       super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->triple_).a_.a_);
          pstore::indirect_string::to_string_abi_cxx11_
                    ((string *)&compilation_1,(indirect_string *)&definitions);
          testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                    ((internal *)&local_4f8,"load_string (import_db_, compilation->triple ())",
                     "triple",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &compilation_1,&triple);
          if (compilation_1.addr.a_.a_ != (address)local_490) {
            operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1)
            ;
          }
          if (local_4f8.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&compilation_1);
            if (local_4f0 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = (local_4f0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&definitions,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                       ,300,pcVar11);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&definitions,(Message *)&compilation_1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&definitions);
            if (compilation_1.addr.a_.a_ != 0) {
              (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
            }
          }
          if (local_4f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4f0,local_4f0);
          }
          definitions.
          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(definitions.
                                 super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (compilation.
                                  super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->size_);
          local_4f8.data_._0_4_ = 2;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&compilation_1,"compilation->size ()","2U",(uint *)&definitions,
                     (uint *)&local_4f8);
          if ((char)compilation_1.addr.a_.a_ == '\0') {
            testing::Message::Message((Message *)&definitions);
            if (compilation_1.size == 0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = *(char **)compilation_1.size;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_4f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                       ,0x12d,pcVar11);
            testing::internal::AssertHelper::operator=(&local_4f8,(Message *)&definitions);
            testing::internal::AssertHelper::~AssertHelper(&local_4f8);
            if (definitions.
                super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)((long)((definitions.
                                   super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
          }
          else {
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            peVar3 = compilation.
                     super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            if ((compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_ == 0) {
              pstore::assert_failed
                        ("i < size_",
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/compilation.hpp"
                         ,0xa9);
            }
            testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                      ((internal *)&compilation_1,"def1.digest","fragment_digest",
                       &(compilation.
                         super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->members_[0].digest,&fragment_digest);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x130,pcVar11);
              testing::internal::AssertHelper::operator=(&local_4f8,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper(&local_4f8);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            pstore::indirect_string::read((int)&definitions,pdVar10,peVar3->members_[0].name.a_.a_);
            pstore::indirect_string::to_string_abi_cxx11_
                      ((string *)&compilation_1,(indirect_string *)&definitions);
            testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                      ((internal *)&local_4f8,"load_string (import_db_, def1.name)","name1",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &compilation_1,&name1);
            if (compilation_1.addr.a_.a_ != (address)local_490) {
              operator_delete((void *)compilation_1.addr.a_.a_,
                              local_490[0]._M_allocated_capacity + 1);
            }
            if (local_4f8.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&compilation_1);
              if (local_4f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = (local_4f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&definitions,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x131,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&definitions,(Message *)&compilation_1);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&definitions);
              if (compilation_1.addr.a_.a_ != 0) {
                (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
              }
            }
            if (local_4f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4f0,local_4f0);
            }
            definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(CONCAT71(definitions.
                                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    peVar3->members_[0].field_3.bf) & 0xffffffffffffff0f);
            local_4f8.data_._0_1_ = (internal)0x4;
            testing::internal::CmpHelperEQ<pstore::repo::linkage,pstore::repo::linkage>
                      ((internal *)&compilation_1,"def1.linkage ()",
                       "pstore::repo::linkage::external",(linkage *)&definitions,
                       (linkage *)&local_4f8);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x132,pcVar11);
              testing::internal::AssertHelper::operator=(&local_4f8,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper(&local_4f8);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(CONCAT71(definitions.
                                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    peVar3->members_[0].field_3.bf >> 4) & 0xffffffffffffff03);
            local_4f8.data_._0_1_ = (internal)0x1;
            testing::internal::CmpHelperEQ<pstore::repo::visibility,pstore::repo::visibility>
                      ((internal *)&compilation_1,"def1.visibility ()",
                       "pstore::repo::visibility::hidden_vis",(visibility *)&definitions,
                       (visibility *)&local_4f8);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x133,pcVar11);
              testing::internal::AssertHelper::operator=(&local_4f8,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper(&local_4f8);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            peVar3 = compilation.
                     super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            if ((compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_ < 2) {
              pstore::assert_failed
                        ("i < size_",
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/compilation.hpp"
                         ,0xa9);
            }
            testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                      ((internal *)&compilation_1,"def2.digest","fragment_digest",
                       (uint128 *)
                       (compilation.
                        super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 1),&fragment_digest);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x137,pcVar11);
              testing::internal::AssertHelper::operator=(&local_4f8,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper(&local_4f8);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            pstore::indirect_string::read
                      ((int)&definitions,pdVar10,(size_t)peVar3[1].members_[0].digest.v_);
            pstore::indirect_string::to_string_abi_cxx11_
                      ((string *)&compilation_1,(indirect_string *)&definitions);
            testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                      ((internal *)&local_4f8,"load_string (import_db_, def2.name)","name2",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &compilation_1,&name2);
            if (compilation_1.addr.a_.a_ != (address)local_490) {
              operator_delete((void *)compilation_1.addr.a_.a_,
                              local_490[0]._M_allocated_capacity + 1);
            }
            if (local_4f8.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&compilation_1);
              if (local_4f0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = (local_4f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&definitions,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x138,pcVar11);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&definitions,(Message *)&compilation_1);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&definitions);
              if (compilation_1.addr.a_.a_ != 0) {
                (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
              }
            }
            if (local_4f0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_4f0,local_4f0);
            }
            definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(CONCAT71(definitions.
                                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    *(undefined1 *)((long)&peVar3[1].members_[0].digest.v_ + 8)) &
                          0xffffffffffffff0f);
            local_4f8.data_._0_1_ = (internal)0x5;
            testing::internal::CmpHelperEQ<pstore::repo::linkage,pstore::repo::linkage>
                      ((internal *)&compilation_1,"def2.linkage ()",
                       "pstore::repo::linkage::link_once_any",(linkage *)&definitions,
                       (linkage *)&local_4f8);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x139,pcVar11);
              testing::internal::AssertHelper::operator=(&local_4f8,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper(&local_4f8);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(CONCAT71(definitions.
                                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    *(byte *)((long)&peVar3[1].members_[0].digest.v_ + 8) >> 4) &
                          0xffffffffffffff03);
            local_4f8.data_ = local_4f8.data_ & 0xffffffffffffff00;
            testing::internal::CmpHelperEQ<pstore::repo::visibility,pstore::repo::visibility>
                      ((internal *)&compilation_1,"def2.visibility ()",
                       "pstore::repo::visibility::default_vis",(visibility *)&definitions,
                       (visibility *)&local_4f8);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar11 = "";
              }
              else {
                pcVar11 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_4f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x13a,pcVar11);
              testing::internal::AssertHelper::operator=(&local_4f8,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper(&local_4f8);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            pstore::transaction_base::commit(&transaction.super_transaction_base);
          }
          if (compilation.
              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (compilation.
                       super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        if ((_Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_>_>_>
             )local_2b0._M_head_impl !=
            (pair<const_pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)0x0) {
          operator_delete(local_2b0._M_head_impl,0x20);
        }
      }
      else {
        testing::Message::Message((Message *)&local_4f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_4f8.data_)->line,"JSON error was: ",0x10);
        (**(code **)(*(long *)local_338 + 0x20))(&compilation_1,local_338,local_368._40_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_4f8.data_)->line,(char *)compilation_1.addr.a_.a_,
                   compilation_1.size);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_4f8.data_)->line,(char *)&definitions,1);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x28);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&(local_4f8.data_)->line,(char *)&definitions,1);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x3a);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&definitions,1);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x29);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&definitions,1);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_4f8.data_)->line,(char *)&definitions,1);
        psVar7 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                           (&exported_compilation_stream);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_4f8.data_)->line,(psVar7->_M_dataplus)._M_p,
                   psVar7->_M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&definitions,(internal *)&compilation,
                   (AssertionResult *)"compilation_parser.has_error ()","true","false",pcVar11);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mutex_1,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                   ,0x11e,(char *)definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mutex_1,(Message *)&local_4f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex_1);
        if (definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&definitions.
                      super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((definitions.
                                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         digest).v_ + 1));
        }
        if (compilation_1.addr.a_.a_ != (address)local_490) {
          operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1);
        }
        if ((section_content *)local_4f8.data_ != (section_content *)0x0) {
          (**(code **)(*(long *)local_4f8.data_ + 8))();
        }
        if (compilation.
            super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&compilation.
                           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       compilation.
                       super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_p != local_308) {
          operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
        }
        if (local_328._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328._M_pi);
        }
        std::
        deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
        ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                  *)(local_398 + 8));
        if ((mock_mutex *)local_398._0_8_ != (mock_mutex *)0x0) {
          operator_delete((void *)local_398._0_8_,0x68);
        }
      }
      if (compilation_index.
          super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (compilation_index.
                   super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      goto LAB_00138660;
    }
    testing::Message::Message((Message *)&compilation);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,"JSON error was: ",0x10);
    (**(code **)(*(long *)local_338 + 0x20))(&compilation_1,local_338,local_368._40_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)compilation_1.addr.a_.a_,compilation_1.size);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)&definitions,1);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x28);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)
                        &(compilation.
                          super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->size_,(char *)&definitions,1);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x3a);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&definitions,1);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&definitions,1);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)&definitions,1);
    psVar7 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_fragment_stream);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&definitions,(internal *)&compilation_index,
               (AssertionResult *)"fragment_parser.has_error ()","true","false",pcVar11);
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x113,(char *)definitions.
                              super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_4f8,(Message *)&compilation);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    if (definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(definitions.
                      super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((definitions.
                                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->digest).
                                     v_ + 1));
    }
    if (compilation_1.addr.a_.a_ != (address)local_490) {
      operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1);
    }
    if (compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (**(code **)(*(long *)((compilation.
                              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->signature_)._M_elems + 8))();
    }
    if (compilation_index.
        super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&compilation_index.
                       super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   compilation_index.
                   super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_p != local_308) {
      operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
    }
    if (local_328._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)(local_398 + 8));
  }
  else {
    testing::Message::Message((Message *)&compilation);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,"JSON error was: ",0x10);
    (**(code **)(*(long *)local_338 + 0x20))(&compilation_1,local_338,local_368._40_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)compilation_1.addr.a_.a_,compilation_1.size);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)&definitions,1);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x28);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)
                        &(compilation.
                          super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->size_,(char *)&definitions,1);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x3a);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&definitions,1);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&definitions,1);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)&definitions,1);
    psVar7 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&definitions,(internal *)&compilation_index,
               (AssertionResult *)"name_parser.has_error ()","true","false",pcVar11);
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x10a,(char *)definitions.
                              super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_4f8,(Message *)&compilation);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    if (definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(definitions.
                      super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((definitions.
                                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->digest).
                                     v_ + 1));
    }
    if (compilation_1.addr.a_.a_ != (address)local_490) {
      operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1);
    }
    if (compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (**(code **)(*(long *)((compilation.
                              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->signature_)._M_elems + 8))();
    }
    if (compilation_index.
        super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&compilation_index.
                       super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   compilation_index.
                   super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_p != local_308) {
      operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
    }
    if (local_328._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)(local_398 + 8));
  }
  if ((mock_mutex *)local_398._0_8_ != (mock_mutex *)0x0) {
    operator_delete((void *)local_398._0_8_,0x68);
  }
LAB_00138660:
  pstore::exchange::import_ns::string_mapping::~string_mapping(&imported_names);
  transaction.super_transaction_base._vptr_transaction_base =
       (_func_int **)&PTR__transaction_00234578;
  pstore::transaction_base::rollback(&transaction.super_transaction_base);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_fragment_stream);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_compilation_stream);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_names_stream);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&exported_names);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&indir_strings._M_h);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, TwoDefinitions) {
    using namespace pstore::exchange;
    constexpr auto comments = false;

    // Add names to the store so that external fixups can use then. add_export_strings()
    // yields a mapping from each name to its indirect-address.
    constexpr auto * name1 = "name1";
    constexpr auto * name2 = "name2";
    constexpr auto * triple = "triple";
    constexpr auto name_index = pstore::trailer::indices::name;

    std::array<pstore::gsl::czstring, 3> names{{triple, name1, name2}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<name_index> (export_db_, std::begin (names), std::end (names),
                                    std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<name_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                         export_db_.get_current_revision (), "", &exported_names,
                                         comments);

    // Now build a single fragment and a compilation that references it then export them.
    constexpr pstore::index::digest compilation_digest{0x12345678, 0x9ABCDEF0};
    constexpr pstore::index::digest fragment_digest{0x9ABCDEF0, 0x12345678};

    export_ns::ostringstream exported_compilation_stream;
    export_ns::ostringstream exported_fragment_stream;

    {
        mock_mutex mutex;
        auto transaction = begin (export_db_, transaction_lock{mutex});
        pstore::extent<pstore::repo::fragment> const fext =
            build_fragment (transaction, fragment_digest);
        emit_fragment (exported_fragment_stream, export_ns::indent{}, export_db_, exported_names,
                       export_db_.getro (fext), comments);

        std::vector<pstore::repo::definition> definitions{
            {fragment_digest, fext, indir_strings[name1], pstore::repo::linkage::external,
             pstore::repo::visibility::hidden_vis},
            {fragment_digest, fext, indir_strings[name2], pstore::repo::linkage::link_once_any,
             pstore::repo::visibility::default_vis},
        };
        pstore::extent<pstore::repo::compilation> const compilation =
            pstore::repo::compilation::alloc (transaction, indir_strings[triple],
                                              std::begin (definitions), std::end (definitions));

        emit_compilation (exported_compilation_stream, export_ns::indent{}, export_db_,
                          *export_db_.getro (compilation), exported_names, comments);
        transaction.commit ();
    }


    // Now begin to export the three pieces: the names, the fragment, and finally the compilation.
    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});


    import_ns::string_mapping imported_names;
    {
        auto name_parser = import_strings_parser (&transaction, &imported_names);
        name_parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_names_stream.str ();
    }
    {
        auto fragment_parser =
            import_fragment_parser (&transaction, &imported_names, &fragment_digest);
        fragment_parser.input (exported_fragment_stream.str ()).eof ();
        ASSERT_FALSE (fragment_parser.has_error ())
            << "JSON error was: " << fragment_parser.last_error ().message () << ' '
            << fragment_parser.coordinate () << '\n'
            << exported_fragment_stream.str ();
    }
    {
        auto const fragment_index =
            pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
        auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                             fragment_index, compilation_digest);
        compilation_parser.input (exported_compilation_stream.str ()).eof ();
        ASSERT_FALSE (compilation_parser.has_error ())
            << "JSON error was: " << compilation_parser.last_error ().message () << ' '
            << compilation_parser.coordinate () << '\n'
            << exported_compilation_stream.str ();
    }

    // Everything is now imported. Let's check what the resulting compilation record looks like.
    auto const compilation_index =
        pstore::index::get_index<pstore::trailer::indices::compilation> (import_db_);
    auto const pos = compilation_index->find (import_db_, compilation_digest);
    ASSERT_NE (pos, compilation_index->end (import_db_))
        << "Compilation was not found in the index after import";

    auto const compilation = import_db_.getro (pos->second);
    EXPECT_EQ (load_string (import_db_, compilation->triple ()), triple);
    ASSERT_EQ (compilation->size (), 2U);
    {
        pstore::repo::definition const & def1 = (*compilation)[0];
        EXPECT_EQ (def1.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def1.name), name1);
        EXPECT_EQ (def1.linkage (), pstore::repo::linkage::external);
        EXPECT_EQ (def1.visibility (), pstore::repo::visibility::hidden_vis);
    }
    {
        pstore::repo::definition const & def2 = (*compilation)[1];
        EXPECT_EQ (def2.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def2.name), name2);
        EXPECT_EQ (def2.linkage (), pstore::repo::linkage::link_once_any);
        EXPECT_EQ (def2.visibility (), pstore::repo::visibility::default_vis);
    }

    transaction.commit ();
}